

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O2

void __thiscall
dlib::con_<512l,1l,1l,1,1,0,0>::
setup<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<128l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<128l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,void>,void>,true,void>>
          (con_<512l,1l,1l,1,1,0,0> *this,
          subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub)

{
  long lVar1;
  long lVar2;
  size_t offset;
  alias_tensor_instance local_1440;
  rand rnd;
  
  lVar1 = *(long *)(this + 0x168);
  lVar2 = *(long *)((long)(((sub->l->subnetwork)._M_t.
                            super___uniq_ptr_impl<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
                            .
                            super__Head_base<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
                           ._M_head_impl)->subnetwork)._M_t + 0x238);
  resizable_tensor::set_size
            ((resizable_tensor *)this,((ulong)(byte)this[0x178] + lVar2) * lVar1,1,1,1);
  ::rand();
  rand::rand(&rnd);
  randomize_parameters((tensor *)this,lVar1 + lVar2,&rnd);
  lVar1 = *(long *)(this + 0x168);
  lVar2 = *(long *)((long)(((sub->l->subnetwork)._M_t.
                            super___uniq_ptr_impl<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
                            .
                            super__Head_base<0UL,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
                           ._M_head_impl)->subnetwork)._M_t + 0x238);
  *(long *)(this + 0xa0) = lVar1;
  *(long *)(this + 0xa8) = lVar2;
  offset = lVar2 * lVar1;
  *(undefined8 *)(this + 0xb0) = 1;
  *(undefined8 *)(this + 0xb8) = 1;
  *(size_t *)(this + 0xc0) = offset;
  *(undefined8 *)(this + 200) = 0;
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  if (this[0x178] == (con_<512l,1l,1l,1,1,0,0>)0x1) {
    *(undefined8 *)(this + 0xe8) = 1;
    *(long *)(this + 0xf0) = lVar1;
    *(undefined8 *)(this + 0xf8) = 1;
    *(undefined8 *)(this + 0x100) = 1;
    *(long *)(this + 0x108) = lVar1;
    *(undefined8 *)(this + 0x120) = 0;
    *(undefined8 *)(this + 0x110) = 0;
    *(undefined8 *)(this + 0x118) = 0;
    alias_tensor::operator()(&local_1440,(alias_tensor *)(this + 0xe0),(tensor *)this,offset);
    tensor::operator=(&local_1440.super_tensor,0.0);
  }
  rand::~rand(&rnd);
  return;
}

Assistant:

void setup (const SUBNET& sub)
        {
            const long filt_nr = _nr!=0 ? _nr : sub.get_output().nr();
            const long filt_nc = _nc!=0 ? _nc : sub.get_output().nc();

            long num_inputs = filt_nr*filt_nc*sub.get_output().k();
            long num_outputs = num_filters_;
            // allocate params for the filters and also for the filter bias values.
            params.set_size(num_inputs*num_filters_ + static_cast<int>(use_bias) * num_filters_);

            dlib::rand rnd(std::rand());
            randomize_parameters(params, num_inputs+num_outputs, rnd);

            filters = alias_tensor(num_filters_, sub.get_output().k(), filt_nr, filt_nc);
            if (use_bias)
            {
                biases = alias_tensor(1,num_filters_);
                // set the initial bias values to zero
                biases(params,filters.size()) = 0;
            }
        }